

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O0

void acutest_message_color_(int color,char *fmt,...)

{
  char in_AL;
  char *pcVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  int iVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined4 local_448;
  undefined4 local_444;
  va_list args;
  char *line_end;
  char *line_beg;
  char buffer [1024];
  char *fmt_local;
  int color_local;
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Qa;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  if (((1 < acutest_verbose_level_) && (acutest_current_test_ != (acutest_test_ *)0x0)) &&
     (acutest_cond_failed_ != 0)) {
    args[0].overflow_arg_area = local_4f8;
    args[0]._0_8_ = &stack0x00000008;
    local_444 = 0x30;
    local_448 = 0x10;
    local_4e8 = in_RDX;
    local_4e0 = in_RCX;
    local_4d8 = in_R8;
    local_4d0 = in_R9;
    buffer._1016_8_ = fmt;
    vsnprintf((char *)&line_beg,0x400,fmt,&local_448);
    buffer[0x3f7] = '\0';
    line_end = (char *)&line_beg;
    while (pcVar1 = strchr(line_end,10), pcVar1 != (char *)0x0) {
      iVar2 = 2;
      if (acutest_case_name_[0] != '\0') {
        iVar2 = 3;
      }
      acutest_line_indent_(iVar2);
      acutest_colored_printf_(color,"%.*s\n",(ulong)(uint)((int)pcVar1 - (int)line_end),line_end);
      line_end = pcVar1 + 1;
    }
    if (*line_end != '\0') {
      iVar2 = 2;
      if (acutest_case_name_[0] != '\0') {
        iVar2 = 3;
      }
      acutest_line_indent_(iVar2);
      printf("%s\n",line_end);
    }
  }
  return;
}

Assistant:

acutest_message_color_(int color, const char* fmt, ...)
{
    char buffer[TEST_MSG_MAXSIZE];
    char* line_beg;
    char* line_end;
    va_list args;

    if(acutest_verbose_level_ < 2)
        return;

    /* We allow extra message only when something is already wrong in the
     * current test. */
    if(acutest_current_test_ == NULL  ||  !acutest_cond_failed_)
        return;

    va_start(args, fmt);
    vsnprintf(buffer, TEST_MSG_MAXSIZE, fmt, args);
    va_end(args);
    buffer[TEST_MSG_MAXSIZE-1] = '\0';

    line_beg = buffer;
    while(1) {
        line_end = strchr(line_beg, '\n');
        if(line_end == NULL)
            break;
        acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
        acutest_colored_printf_(color, "%.*s\n", (int)(line_end - line_beg), line_beg);
        line_beg = line_end + 1;
    }
    if(line_beg[0] != '\0') {
        acutest_line_indent_(acutest_case_name_[0] ? 3 : 2);
        printf("%s\n", line_beg);
    }
}